

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  string_t new_value;
  string_t new_value_00;
  uint uVar1;
  string_t *psVar2;
  idx_t iVar3;
  long in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state_1;
  idx_t sidx_1;
  idx_t i_1;
  string_t *sort_key_data;
  Vector sliced_input;
  SelectionVector sel;
  OrderModifiers modifiers;
  Vector sort_key;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state;
  idx_t sidx;
  bool arg_null;
  idx_t aidx;
  string_t bval;
  idx_t bidx;
  idx_t i;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> **states;
  idx_t assign_count;
  sel_t assign_sel [2048];
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *last_state;
  UnifiedVectorFormat sdata;
  string_t *bys;
  bool extra_state;
  UnifiedVectorFormat bdata;
  Vector *by;
  UnifiedVectorFormat adata;
  Vector *arg;
  UnifiedVectorFormat *in_stack_ffffffffffffdcf8;
  Vector *in_stack_ffffffffffffdd00;
  undefined5 in_stack_ffffffffffffdd08;
  undefined1 in_stack_ffffffffffffdd0d;
  undefined1 in_stack_ffffffffffffdd0e;
  undefined1 in_stack_ffffffffffffdd0f;
  Vector *by_00;
  sel_t *in_stack_ffffffffffffdd18;
  LogicalType *in_stack_ffffffffffffdd20;
  idx_t in_stack_ffffffffffffdd28;
  SelectionVector *in_stack_ffffffffffffdd30;
  Vector *in_stack_ffffffffffffdd38;
  Vector *in_stack_ffffffffffffdd40;
  idx_t idx;
  Vector *in_stack_ffffffffffffdd58;
  idx_t in_stack_ffffffffffffdd60;
  Vector *in_stack_ffffffffffffdd68;
  OrderModifiers in_stack_ffffffffffffdd76;
  UnifiedVectorFormat *in_stack_ffffffffffffddc0;
  element_type *in_stack_ffffffffffffddc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffddd0;
  OrderModifiers local_2222 [67];
  undefined4 local_219c;
  undefined8 local_2198;
  char *pcStack_2190;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *local_2188;
  idx_t local_2180;
  byte local_2171;
  idx_t local_2170;
  undefined8 local_2168;
  char *pcStack_2160;
  idx_t local_2158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2150;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> **local_2148;
  ulong local_2140;
  uint local_2138 [2048];
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *local_138;
  UnifiedVectorFormat local_130;
  string_t *local_e8;
  undefined1 local_d9;
  UnifiedVectorFormat local_d8;
  long local_90;
  SelectionVector *local_78 [10];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  long local_8;
  
  by_00 = (Vector *)local_78;
  local_28._M_pi = in_R8;
  local_8 = in_RDI;
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)by_00);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_ffffffffffffddd0._M_pi,(idx_t)in_stack_ffffffffffffddc8,
             in_stack_ffffffffffffddc0);
  local_90 = local_8 + 0x68;
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)by_00);
  local_d9 = SpecializedGenericArgMinMaxState::CreateExtraState((idx_t)local_28._M_pi);
  SpecializedGenericArgMinMaxState::PrepareData
            (by_00,CONCAT17(in_stack_ffffffffffffdd0f,
                            CONCAT16(in_stack_ffffffffffffdd0e,
                                     CONCAT15(in_stack_ffffffffffffdd0d,in_stack_ffffffffffffdd08)))
             ,(bool *)in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
  local_e8 = UnifiedVectorFormat::GetData<duckdb::string_t>(&local_d8);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)by_00);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_ffffffffffffddd0._M_pi,(idx_t)in_stack_ffffffffffffddc8,
             in_stack_ffffffffffffddc0);
  local_138 = (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *)0x0;
  local_2140 = 0;
  local_2148 = UnifiedVectorFormat::
               GetData<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>*>(&local_130);
  for (local_2150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; local_2150 < local_28._M_pi
      ; local_2150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&local_2150->_vptr__Sp_counted_base + 1)) {
    local_2158 = SelectionVector::get_index(local_d8.sel,(idx_t)local_2150);
    in_stack_ffffffffffffdd0f =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   ((TemplatedValidityMask<unsigned_long> *)
                    CONCAT17(in_stack_ffffffffffffdd0f,
                             CONCAT16(in_stack_ffffffffffffdd0e,
                                      CONCAT15(in_stack_ffffffffffffdd0d,in_stack_ffffffffffffdd08))
                            ),(idx_t)in_stack_ffffffffffffdd00);
    if ((bool)in_stack_ffffffffffffdd0f) {
      local_2168 = *(undefined8 *)&local_e8[local_2158].value;
      pcStack_2160 = local_e8[local_2158].value.pointer.ptr;
      local_2170 = SelectionVector::get_index(local_78[0],(idx_t)local_2150);
      in_stack_ffffffffffffdd0e =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     ((TemplatedValidityMask<unsigned_long> *)
                      CONCAT17(in_stack_ffffffffffffdd0f,
                               CONCAT16(in_stack_ffffffffffffdd0e,
                                        CONCAT15(in_stack_ffffffffffffdd0d,in_stack_ffffffffffffdd08
                                                ))),(idx_t)in_stack_ffffffffffffdd00);
      local_2171 = (in_stack_ffffffffffffdd0e ^ 0xff) & 1;
      local_2180 = SelectionVector::get_index(local_130.sel,(idx_t)local_2150);
      local_2188 = local_2148[local_2180];
      if ((((local_2188->super_ArgMinMaxStateBase).is_initialized & 1U) == 0) ||
         (in_stack_ffffffffffffdd0d =
               LessThan::Operation<duckdb::string_t>
                         ((string_t *)in_stack_ffffffffffffdd00,
                          (string_t *)in_stack_ffffffffffffdcf8), (bool)in_stack_ffffffffffffdd0d))
      {
        local_2198 = local_2168;
        pcStack_2190 = pcStack_2160;
        new_value.value.pointer.ptr = (char *)in_stack_ffffffffffffdd30;
        new_value.value._0_8_ = in_stack_ffffffffffffdd28;
        ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                  ((string_t *)in_stack_ffffffffffffdd20,new_value);
        (local_2188->super_ArgMinMaxStateBase).arg_null = (bool)(local_2171 & 1);
        if ((local_2171 & 1) == 0) {
          if (local_2188 == local_138) {
            local_2140 = local_2140 - 1;
          }
          uVar1 = UnsafeNumericCast<unsigned_int,unsigned_long,void>((unsigned_long)local_2150);
          local_2138[local_2140] = uVar1;
          local_138 = local_2188;
          local_2140 = local_2140 + 1;
        }
        (local_2188->super_ArgMinMaxStateBase).is_initialized = true;
      }
    }
  }
  if (local_2140 == 0) {
    local_219c = 1;
  }
  else {
    LogicalType::LogicalType
              (in_stack_ffffffffffffdd20,(LogicalTypeId)((ulong)in_stack_ffffffffffffdd18 >> 0x38));
    Vector::Vector(in_stack_ffffffffffffdd40,(LogicalType *)in_stack_ffffffffffffdd38,
                   (idx_t)in_stack_ffffffffffffdd30);
    LogicalType::~LogicalType((LogicalType *)0x1c3826b);
    OrderModifiers::OrderModifiers(local_2222,ASCENDING,NULLS_LAST);
    SelectionVector::SelectionVector
              ((SelectionVector *)in_stack_ffffffffffffdd20,in_stack_ffffffffffffdd18);
    Vector::Vector(in_stack_ffffffffffffdd40,in_stack_ffffffffffffdd38,in_stack_ffffffffffffdd30,
                   in_stack_ffffffffffffdd28);
    CreateSortKeyHelpers::CreateSortKey
              (in_stack_ffffffffffffdd68,in_stack_ffffffffffffdd60,in_stack_ffffffffffffdd76,
               in_stack_ffffffffffffdd58);
    psVar2 = FlatVector::GetData<duckdb::string_t>((Vector *)0x1c382fa);
    for (idx = 0; idx < local_2140; idx = idx + 1) {
      in_stack_ffffffffffffdd00 = (Vector *)local_130.sel;
      iVar3 = SelectionVector::get_index((SelectionVector *)&stack0xffffffffffffddc0,idx);
      iVar3 = SelectionVector::get_index((SelectionVector *)in_stack_ffffffffffffdd00,iVar3);
      new_value_00.value.pointer.ptr = (char *)local_2148[iVar3];
      new_value_00.value._0_8_ = in_stack_ffffffffffffdd28;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((string_t *)psVar2[idx].value.pointer.ptr,new_value_00);
    }
    Vector::~Vector(in_stack_ffffffffffffdd00);
    SelectionVector::~SelectionVector((SelectionVector *)0x1c38434);
    Vector::~Vector(in_stack_ffffffffffffdd00);
    local_219c = 0;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffdd00);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffdd00);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffdd00);
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}